

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerPool.cpp
# Opt level: O0

PoolHandle __thiscall TimerPool::Create(TimerPool *this,string *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PoolHandle PVar1;
  undefined1 local_28 [24];
  string *name_local;
  
  local_28._16_8_ = name;
  name_local = (string *)this;
  std::make_shared<(anonymous_namespace)::EnableConstructor<TimerPool>,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::shared_ptr<TimerPool>::shared_ptr<(anonymous_namespace)::EnableConstructor<TimerPool>,void>
            ((shared_ptr<TimerPool> *)this,
             (shared_ptr<(anonymous_namespace)::EnableConstructor<TimerPool>_> *)local_28);
  std::shared_ptr<(anonymous_namespace)::EnableConstructor<TimerPool>_>::~shared_ptr
            ((shared_ptr<(anonymous_namespace)::EnableConstructor<TimerPool>_> *)local_28);
  PVar1.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PoolHandle)PVar1.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerPool::PoolHandle TimerPool::Create(const std::string& name)
{
    return std::make_shared<EnableConstructor<TimerPool>>(name);
}